

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_2::StencilRefSeparateTestCase::test
          (StencilRefSeparateTestCase *this)

{
  CallLogWrapper *this_00;
  int iVar1;
  RenderTarget *pRVar2;
  int iVar3;
  uint mask;
  
  iVar3 = 0;
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             (ulong)this->m_testTargetName,0);
  ApiCase::expectError(&this->super_ApiCase,0);
  pRVar2 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  iVar1 = pRVar2->m_stencilBits;
  if (0 < iVar1) {
    this_00 = &(this->super_ApiCase).super_CallLogWrapper;
    do {
      mask = 1 << ((byte)iVar3 & 0x1f);
      glu::CallLogWrapper::glStencilFuncSeparate(this_00,this->m_stencilFuncTargetFace,0x207,mask,0)
      ;
      ApiCase::expectError(&this->super_ApiCase,0);
      (*this->m_verifier->_vptr_StateVerifier[2])
                (this->m_verifier,
                 (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 (ulong)this->m_testTargetName,(ulong)mask);
      ApiCase::expectError(&this->super_ApiCase,0);
      glu::CallLogWrapper::glStencilFuncSeparate
                (this_00,this->m_stencilFuncTargetFace,0x207,mask,mask);
      ApiCase::expectError(&this->super_ApiCase,0);
      (*this->m_verifier->_vptr_StateVerifier[2])
                (this->m_verifier,
                 (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 (ulong)this->m_testTargetName,(ulong)mask);
      ApiCase::expectError(&this->super_ApiCase,0);
      iVar3 = iVar3 + 1;
    } while (iVar1 != iVar3);
  }
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, m_testTargetName, 0);
		expectError(GL_NO_ERROR);

		const int stencilBits = m_context.getRenderTarget().getStencilBits();

		for (int stencilBit = 0; stencilBit < stencilBits; ++stencilBit)
		{
			const int ref = 1 << stencilBit;

			glStencilFuncSeparate(m_stencilFuncTargetFace, GL_ALWAYS, ref, 0);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_testTargetName, ref);
			expectError(GL_NO_ERROR);

			glStencilFuncSeparate(m_stencilFuncTargetFace, GL_ALWAYS, ref, ref);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_testTargetName, ref);
			expectError(GL_NO_ERROR);
		}
	}